

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworksByAliases
          (Registry *this,StringArray *aAliases,NetworkArray *aRet,StringArray *aUnresolved)

{
  size_t sVar1;
  undefined8 uVar2;
  Network *pNVar3;
  DomainId DVar4;
  pointer pNVar5;
  ErrorCode EVar6;
  Status SVar7;
  int iVar8;
  undefined4 uVar9;
  undefined7 extraout_var;
  long *plVar10;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  ulong uVar11;
  Network *pNVar12;
  iterator iVar13;
  undefined7 extraout_var_03;
  Network *extraout_RAX;
  size_type *psVar14;
  pointer pNVar15;
  long lVar16;
  char *pcVar17;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  __i;
  long lVar18;
  Network *pNVar19;
  pointer __x;
  Network *pNVar20;
  NetworkArray networks;
  uint16_t pid;
  string aliasAsPanId;
  uint64_t xpid;
  Network nwk;
  NetworkArray local_158;
  undefined4 local_138;
  unsigned_short local_132;
  undefined1 *local_130;
  _Alloc_hider local_128;
  undefined1 local_120 [8];
  char local_118 [16];
  StringArray *local_108;
  ulong local_100;
  string local_f8;
  vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
  *local_d8;
  StringArray *local_d0;
  pointer local_c8;
  uint64_t local_c0;
  undefined1 local_b8 [56];
  _Alloc_hider local_80;
  char local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char local_48 [24];
  
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (Network *)0x0;
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Network *)0x0;
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (aAliases->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (aAliases->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_108 = aUnresolved;
  local_d8 = (vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
              *)aRet;
  local_d0 = aAliases;
  if (local_c8 == __x) {
    SVar7 = kError;
  }
  else {
    local_100 = 0;
    do {
      sVar1 = __x->_M_string_length;
      if (((sVar1 == DAT_00297d58) &&
          ((sVar1 == 0 ||
           (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_ALL_abi_cxx11_,sVar1),
           iVar8 == 0)))) ||
         ((sVar1 == DAT_00297d78 &&
          ((sVar1 == 0 ||
           (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_,sVar1
                        ), iVar8 == 0)))))) {
        iVar13._M_current =
             (Network *)
             ((long)(local_d0->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_d0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        SVar7 = kError;
        iVar8 = 6;
        if (iVar13._M_current == (Network *)0x20) {
          SVar7 = GetAllNetworks(this,&local_158);
          iVar13._M_current = (Network *)CONCAT71(extraout_var_00,SVar7);
          if (SVar7 == kSuccess) {
            sVar1 = __x->_M_string_length;
            if ((sVar1 != DAT_00297d78) ||
               ((sVar1 != 0 &&
                (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_,
                              sVar1), iVar8 != 0)))) {
              uVar9 = 0;
              goto LAB_00182993;
            }
            Network::Network((Network *)local_b8);
            SVar7 = GetCurrentNetwork(this,(Network *)local_b8);
            uVar9 = (undefined4)CONCAT71(extraout_var_03,SVar7);
            iVar8 = 6;
            if (SVar7 == kSuccess) {
              lVar16 = ((long)local_158.
                              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_158.
                              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555
                       >> 2;
              pNVar15 = local_158.
                        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (0 < lVar16) {
                pNVar15 = local_158.
                          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16 * 4;
                lVar16 = lVar16 + 1;
                iVar13._M_current =
                     local_158.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2;
                do {
                  if (local_b8._0_4_ == iVar13._M_current[-2].mId.mId) {
                    iVar13._M_current = iVar13._M_current + -2;
                    goto LAB_00182c43;
                  }
                  if (local_b8._0_4_ == iVar13._M_current[-1].mId.mId) {
                    iVar13._M_current = iVar13._M_current + -1;
                    goto LAB_00182c43;
                  }
                  if (local_b8._0_4_ == ((iVar13._M_current)->mId).mId) goto LAB_00182c43;
                  if (local_b8._0_4_ == iVar13._M_current[1].mId.mId) {
                    iVar13._M_current = iVar13._M_current + 1;
                    goto LAB_00182c43;
                  }
                  lVar16 = lVar16 + -1;
                  iVar13._M_current = iVar13._M_current + 4;
                } while (1 < lVar16);
              }
              lVar16 = ((long)local_158.
                              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar15 >> 5) *
                       -0x5555555555555555;
              if (lVar16 == 1) {
LAB_00182c1e:
                iVar13._M_current = pNVar15;
                if (local_b8._0_4_ != (pNVar15->mId).mId) {
                  iVar13._M_current =
                       local_158.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                }
              }
              else if (lVar16 == 2) {
LAB_00182c0f:
                iVar13._M_current = pNVar15;
                if (local_b8._0_4_ != (pNVar15->mId).mId) {
                  pNVar15 = pNVar15 + 1;
                  goto LAB_00182c1e;
                }
              }
              else {
                iVar13._M_current =
                     local_158.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if ((lVar16 == 3) &&
                   (iVar13._M_current = pNVar15, local_b8._0_4_ != (pNVar15->mId).mId)) {
                  pNVar15 = pNVar15 + 1;
                  goto LAB_00182c0f;
                }
              }
LAB_00182c43:
              iVar8 = 0;
              if (iVar13._M_current !=
                  local_158.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ::_M_erase(&local_158,iVar13);
                iVar8 = 0;
              }
            }
            if (local_80._M_p != local_70) {
              operator_delete(local_80._M_p);
            }
            iVar13._M_current = (Network *)(local_b8 + 0x18);
            if ((Network *)local_b8._8_8_ != iVar13._M_current) {
              operator_delete((void *)local_b8._8_8_);
              iVar13._M_current = extraout_RAX;
            }
            if (SVar7 == kSuccess) goto LAB_00182993;
          }
        }
      }
      else {
        if ((sVar1 == DAT_00297d38) &&
           ((sVar1 == 0 ||
            (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_THIS_abi_cxx11_,sVar1
                         ), iVar8 == 0)))) {
          Network::Network((Network *)local_b8);
          SVar7 = GetCurrentNetwork(this,(Network *)local_b8);
          uVar9 = (undefined4)CONCAT71(extraout_var_01,SVar7);
          if ((SVar7 == kSuccess) && (local_b8._0_4_ != 0xffffffff)) {
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::push_back(&local_158,(Network *)local_b8);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_108,__x);
          }
        }
        else {
          Network::Network((Network *)local_b8);
          utils::ParseInteger<unsigned_long>((Error *)&local_130,&local_c0,__x);
          EVar6 = (ErrorCode)local_130;
          if (local_128._M_p != local_118) {
            operator_delete(local_128._M_p);
          }
          if ((EVar6 == kNone) &&
             (SVar7 = GetNetworkByXpan(this,local_c0,(Network *)local_b8), SVar7 == kSuccess)) {
            uVar9 = 0;
          }
          else {
            SVar7 = GetNetworkByName(this,__x,(Network *)local_b8);
            uVar9 = (undefined4)CONCAT71(extraout_var,SVar7);
          }
          if ((char)uVar9 == '\0') {
            uVar9 = 0;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_58,(ulong)__x);
            utils::ToLower((string *)&local_130,(string *)&local_58);
            iVar8 = std::__cxx11::string::compare((char *)&local_130);
            if (local_130 != local_120) {
              operator_delete(local_130);
            }
            if ((char *)local_58._M_allocated_capacity != local_48) {
              operator_delete((void *)local_58._M_allocated_capacity);
            }
            pcVar17 = "0x";
            if (iVar8 == 0) {
              pcVar17 = anon_var_dwarf_6dd7b0 + 9;
            }
            local_130 = local_120;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_130,pcVar17,pcVar17 + (ulong)(iVar8 != 0) * 2);
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_130,(ulong)(__x->_M_dataplus)._M_p);
            psVar14 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_f8.field_2._M_allocated_capacity = *psVar14;
              local_f8.field_2._8_8_ = plVar10[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar14;
              local_f8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_f8._M_string_length = plVar10[1];
            *plVar10 = (long)psVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if (local_130 != local_120) {
              operator_delete(local_130);
            }
            utils::ParseInteger<unsigned_short>((Error *)&local_130,&local_132,&local_f8);
            EVar6 = (ErrorCode)local_130;
            if (local_128._M_p != local_118) {
              operator_delete(local_128._M_p);
            }
            if (EVar6 == kNone) {
              SVar7 = GetNetworkByPan(this,&local_f8,(Network *)local_b8);
              uVar9 = (undefined4)CONCAT71(extraout_var_02,SVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
          }
          if ((char)uVar9 == '\0') {
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::push_back(&local_158,(Network *)local_b8);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_108,__x);
          }
        }
        if (local_80._M_p != local_70) {
          operator_delete(local_80._M_p);
        }
        if ((Network *)local_b8._8_8_ != (Network *)(local_b8 + 0x18)) {
          operator_delete((void *)local_b8._8_8_);
        }
LAB_00182993:
        pNVar5 = local_158.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pNVar15 = local_158.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_138 = uVar9;
        if (local_158.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_158.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar18 = (long)local_158.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_158.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (lVar18 >> 5) * -0x5555555555555555;
          lVar16 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar16 == 0; lVar16 = lVar16 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                    (local_158.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_158.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar18 < 0x601) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                      (pNVar15,pNVar5);
          }
          else {
            pNVar19 = pNVar15 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                      (pNVar15,pNVar19);
            for (; pNVar19 != pNVar5; pNVar19 = pNVar19 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Val_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                        (pNVar19);
            }
          }
        }
        pNVar15 = local_158.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pNVar19 = local_158.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_158.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_158.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pNVar12 = local_158.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start + -1;
          do {
            pNVar19 = local_158.
                      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pNVar12 + 2 ==
                local_158.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
            pNVar20 = pNVar12 + 1;
            pNVar19 = pNVar12 + 1;
            pNVar3 = pNVar12 + 2;
            pNVar12 = pNVar19;
          } while (pNVar20->mXpan != pNVar3->mXpan);
        }
        iVar13._M_current =
             local_158.
             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (pNVar19 !=
            local_158.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pNVar12 = pNVar19 + 2;
          for (; pNVar12 != pNVar15; pNVar12 = pNVar12 + 1) {
            pNVar20 = pNVar19;
            if (pNVar19->mXpan != pNVar12->mXpan) {
              pNVar20 = pNVar19 + 1;
              DVar4.mId = (pNVar12->mDomainId).mId;
              pNVar19[1].mId = (NetworkId)(pNVar12->mId).mId;
              pNVar19[1].mDomainId = (DomainId)DVar4.mId;
              std::__cxx11::string::operator=((string *)&pNVar19[1].mName,(string *)&pNVar12->mName)
              ;
              uVar2 = *(undefined8 *)((long)&pNVar12->mXpan + 6);
              pNVar19[1].mXpan = pNVar12->mXpan;
              *(undefined8 *)((long)&pNVar19[1].mXpan + 6) = uVar2;
              std::__cxx11::string::operator=((string *)&pNVar19[1].mMlp,(string *)&pNVar12->mMlp);
              pNVar19[1].mCcm = pNVar12->mCcm;
            }
            pNVar19 = pNVar20;
          }
          iVar13._M_current = pNVar19 + 1;
        }
        iVar8 = 0;
        iVar13 = std::
                 vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ::_M_erase(&local_158,iVar13,
                            (iterator)
                            local_158.
                            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        SVar7 = (Status)local_138;
      }
      if (iVar8 != 0) break;
      __x = __x + 1;
      local_100 = CONCAT71((int7)((ulong)iVar13._M_current >> 8),__x == local_c8);
    } while (__x != local_c8);
    if (((local_100 & 1) != 0) &&
       (std::
        vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>>
                  (local_d8,*(undefined8 *)(local_d8 + 8),
                   local_158.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start),
       local_158.
       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       local_158.
       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
       ._M_impl.super__Vector_impl_data._M_start)) {
      SVar7 = kSuccess;
    }
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_158);
  return SVar7;
}

Assistant:

Registry::Status Registry::GetNetworksByAliases(const StringArray &aAliases,
                                                NetworkArray      &aRet,
                                                StringArray       &aUnresolved)
{
    Registry::Status status;
    NetworkArray     networks;

    if (aAliases.size() == 0)
        return Registry::Status::kError;

    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_ALL || alias == ALIAS_OTHER)
        {
            VerifyOrExit(aAliases.size() == 1,
                         status = Registry::Status::kError); // Interpreter must have taken care of this
            VerifyOrExit((status = GetAllNetworks(networks)) == Registry::Status::kSuccess);
            if (alias == ALIAS_OTHER)
            {
                Network nwkThis;
                VerifyOrExit((status = GetCurrentNetwork(nwkThis)) == Registry::Status::kSuccess);
                auto nwkIter = find_if(networks.begin(), networks.end(),
                                       [&nwkThis](const Network &el) { return nwkThis.mId.mId == el.mId.mId; });
                if (nwkIter != networks.end())
                {
                    networks.erase(nwkIter);
                }
            }
        }
        else if (alias == ALIAS_THIS)
        {
            // Get selected nwk xpan (no selected is an error)
            Network nwkThis;
            status = GetCurrentNetwork(nwkThis);
            if (status == Registry::Status::kSuccess && nwkThis.mId.mId != EMPTY_ID)
            {
                // Put nwk into networks
                networks.push_back(nwkThis);
            }
            else // failed 'this' must not break the translation flow
            {
                aUnresolved.push_back(alias);
            }
        }
        else
        {
            Network  nwk;
            uint64_t xpid;
            uint16_t pid;

            status = Registry::Status::kNotFound;
            if (utils::ParseInteger(xpid, alias) == ERROR_NONE)
            {
                status = GetNetworkByXpan(xpid, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                status = GetNetworkByName(alias, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                bool        hasHexPrefix = utils::ToLower(alias.substr(0, 2)) != "0x";
                std::string aliasAsPanId = std::string(hasHexPrefix ? "0x" : "") + alias;

                if (utils::ParseInteger(pid, aliasAsPanId) == ERROR_NONE)
                {
                    status = GetNetworkByPan(aliasAsPanId, nwk);
                }
            }

            if (status == Registry::Status::kSuccess)
            {
                networks.push_back(nwk);
            }
            else // aUnresolved alias must not break processing
            {
                aUnresolved.push_back(alias);
            }
        }

        // Make results unique
        std::sort(networks.begin(), networks.end(),
                  [](Network const &a, Network const &b) { return a.mXpan < b.mXpan; });
        auto last = std::unique(networks.begin(), networks.end(),
                                [](Network const &a, Network const &b) { return a.mXpan == b.mXpan; });
        networks.erase(last, networks.end());
    }

    aRet.insert(aRet.end(), networks.begin(), networks.end());
    if (networks.size() > 0)
    {
        status = Registry::Status::kSuccess;
    }
exit:
    return status;
}